

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

int log_configure_impl(char *name,size_t size,...)

{
  char in_AL;
  int iVar1;
  log_impl plVar2;
  undefined8 *puVar3;
  uint uVar4;
  undefined8 in_RCX;
  ulong uVar5;
  undefined8 in_RDX;
  long lVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list variable_args;
  undefined8 local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c8[2] = in_RDX;
  local_c8[3] = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  plVar2 = log_singleton_get(name);
  if ((plVar2 != (log_impl)0x0) || (iVar1 = log_create(name), iVar1 == 0)) {
    variable_args[0].overflow_arg_area = &stack0x00000008;
    uVar4 = 0x10;
    lVar6 = size + 1;
    do {
      lVar6 = lVar6 + -1;
      if (lVar6 == 0) {
        return 0;
      }
      uVar5 = (ulong)uVar4;
      if (uVar5 < 0x29) {
        uVar4 = uVar4 + 8;
        puVar3 = (undefined8 *)((long)local_c8 + uVar5);
      }
      else {
        puVar3 = (undefined8 *)variable_args[0].overflow_arg_area;
        variable_args[0].overflow_arg_area = (void *)((long)variable_args[0].overflow_arg_area + 8);
      }
      iVar1 = log_define(name,(log_policy)*puVar3);
    } while (iVar1 == 0);
  }
  return 1;
}

Assistant:

int log_configure_impl(const char *name, size_t size, ...)
{
	log_impl impl = log_singleton_get(name);

	size_t iterator;

	va_list variable_args;

	if (impl == NULL)
	{
		if (log_create(name) != 0)
		{
			return 1;
		}
	}

	va_start(variable_args, size);

	for (iterator = 0; iterator < size; ++iterator)
	{
		log_policy policy = va_arg(variable_args, log_policy);

		if (log_define(name, policy) != 0)
		{
			va_end(variable_args);

			return 1;
		}
	}

	va_end(variable_args);

	return 0;
}